

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mksheet.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  allocator<char> local_61;
  Image atlas;
  vector<Image,_std::allocator<Image>_> images;
  
  if (argc < 3 && argc != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," in.pic out.png\n");
    iVar1 = 1;
  }
  else {
    filename = argv[2];
    std::__cxx11::string::string<std::allocator<char>>((string *)&atlas,argv[1],&local_61);
    LoadSpritesheet(&images,(string *)&atlas);
    std::__cxx11::string::~string((string *)&atlas);
    uVar3 = (long)images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5;
    Image::Image(&atlas,(images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                         super__Vector_impl_data._M_start)->width_ * 10,
                 (((int)(uVar3 / 10) + 1) - (uint)(uVar3 % 10 == 0)) *
                 (images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                  super__Vector_impl_data._M_start)->height_);
    lVar4 = 0;
    uVar3 = 0;
    while( true ) {
      if ((ulong)((long)images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5) <= uVar3) break;
      Image::Blit(&atlas,(Image *)((long)&(images.super__Vector_base<Image,_std::allocator<Image>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->width_ + lVar4
                                  ),
                  ((int)((uVar3 & 0xffffffff) / 10) * -10 + (int)uVar3) *
                  *(int *)((long)&(images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                   super__Vector_impl_data._M_start)->width_ + lVar4),
                  (int)((uVar3 & 0xffffffff) / 10) *
                  *(int *)((long)&(images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                   super__Vector_impl_data._M_start)->height_ + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    }
    stbi_write_png(filename,atlas.width_,atlas.height_,3,
                   atlas.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                   super__Vector_impl_data._M_start,atlas.width_ * 3);
    std::_Vector_base<color_t,_std::allocator<color_t>_>::~_Vector_base
              (&atlas.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>);
    std::vector<Image,_std::allocator<Image>_>::~vector(&images);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
  if (argc)

    if (argc < 3) {
      std::cerr << "Usage: " << argv[0] << " in.pic out.png\n";
      return 1;
    }

  auto const in_filename = argv[1];
  auto const out_filename = argv[2];

  auto images = LoadSpritesheet(in_filename);

  auto const spritesheet_width = 10;
  auto const spritesheet_height = images.size() % 10 == 0
                                      ? (int)(images.size() / 10)
                                      : (int)(images.size() / 10) + 1;
  auto atlas = Image{images[0].GetWidth() * spritesheet_width,
                     images[0].GetHeight() * spritesheet_height};

  for (auto i = 0; i < images.size(); ++i) {
    auto& image = images[i];
    atlas.Blit(images[i], (i % spritesheet_width) * image.GetWidth(),
               (i / spritesheet_width) * image.GetHeight());
  }

  // XXX: I'm relying on color_t to serialize properly without
  // intervention which may not be the case on non-x86 platforms
  stbi_write_png(out_filename, atlas.GetWidth(), atlas.GetHeight(),
                 kImageComponents, atlas.GetData().data(),
                 atlas.GetWidth() * kImageComponents);

  return 0;
}